

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

char * load_ref_portion(BGZF *fp,ref_entry *e,int start,int end)

{
  int iVar1;
  int iVar2;
  char *data;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  size_t __size;
  ulong uoffset;
  
  if (end <= start) {
    end = start;
  }
  iVar1 = e->line_length;
  if (iVar1 == 0) {
    uoffset = (ulong)(start - 1);
    uVar4 = (ulong)(end - 1);
  }
  else {
    iVar2 = e->bases_per_line;
    uoffset = ((long)(start + -1) % (long)iVar2 & 0xffffffffU) + e->offset +
              (long)(((start + -1) / iVar2) * iVar1);
    uVar4 = ((long)(end + -1) % (long)iVar2 & 0xffffffffU) + e->offset +
            (long)(((end + -1) / iVar2) * iVar1);
  }
  iVar1 = bgzf_useek(fp,uoffset,0);
  if (iVar1 < 0) {
    perror("bgzf_useek() on reference file");
  }
  else {
    lVar5 = uVar4 - uoffset;
    __size = lVar5 + 1;
    if ((__size != 0) && (data = (char *)malloc(__size), data != (char *)0x0)) {
      sVar3 = bgzf_read(fp,data,__size);
      if (__size == sVar3) {
        iVar1 = (end - start) + 1;
        if (__size == (long)iVar1) {
          if (lVar5 < 0) {
            return data;
          }
          sVar3 = 0;
          do {
            data[sVar3] = data[sVar3] & 0xdf;
            sVar3 = sVar3 + 1;
          } while (__size != sVar3);
          return data;
        }
        if (lVar5 < 0) {
          iVar2 = 0;
        }
        else {
          sVar3 = 0;
          iVar2 = 0;
          do {
            if (0xa1 < (byte)(data[sVar3] + 0x81U)) {
              lVar5 = (long)iVar2;
              iVar2 = iVar2 + 1;
              data[lVar5] = data[sVar3] & 0x5f;
            }
            sVar3 = sVar3 + 1;
          } while (__size != sVar3);
        }
        if (iVar2 == iVar1) {
          return data;
        }
        load_ref_portion_cold_1();
      }
      else {
        perror("bgzf_read() on reference file");
        free(data);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *load_ref_portion(BGZF *fp, ref_entry *e, int start, int end) {
    off_t offset, len;
    char *seq;

    if (end < start)
	end = start;

    /*
     * Compute locations in file. This is trivial for the MD5 files, but
     * is still necessary for the fasta variants.
     */
    offset = e->line_length
	? e->offset + (start-1)/e->bases_per_line * e->line_length +
	  (start-1) % e->bases_per_line
	: start-1;

    len = (e->line_length
	   ? e->offset + (end-1)/e->bases_per_line * e->line_length + 
	     (end-1) % e->bases_per_line
	   : end-1) - offset + 1;

    if (bgzf_useek(fp, offset, SEEK_SET) < 0) {
	perror("bgzf_useek() on reference file");
	return NULL;
    }

    if (len == 0 || !(seq = malloc(len))) {
	return NULL;
    }

    if (len != bgzf_read(fp, seq, len)) {
	perror("bgzf_read() on reference file");
	free(seq);
	return NULL;
    }

    /* Strip white-space if required. */
    if (len != end-start+1) {
	int i, j;
	char *cp = seq;
	char *cp_to;

	for (i = j = 0; i < len; i++) {
	    if (cp[i] >= '!' && cp[i] <= '~')
		cp[j++] = cp[i] & ~0x20;
	}
	cp_to = cp+j;

	if (cp_to - seq != end-start+1) {
	    fprintf(stderr, "Malformed reference file?\n");
	    free(seq);
	    return NULL;
	}
    } else {
	int i;
	for (i = 0; i < len; i++) {
	    seq[i] = seq[i] & ~0x20; // uppercase in ASCII
	}
    }

    return seq;
}